

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  uchar *in_RCX;
  secp256k1_pubkey *pubkey;
  uint64_t *in_RSI;
  secp256k1_context *ctx;
  secp256k1_fe *unaff_R14;
  secp256k1_ge sStack_d8;
  secp256k1_ge_storage sStack_70;
  secp256k1_ge *psStack_30;
  secp256k1_fe *psStack_28;
  
  ctx = (secp256k1_context *)r;
  secp256k1_ge_verify(r);
  if (r->infinity == 0) {
    unaff_R14 = &r->y;
    ctx = (secp256k1_context *)unaff_R14;
    secp256k1_fe_verify(unaff_R14);
    if ((r->y).normalized != 0) {
      if ((unaff_R14->n[0] & 1) == 0) {
        return 0;
      }
      ctx = (secp256k1_context *)unaff_R14;
      secp256k1_fe_verify(unaff_R14);
      if ((r->y).magnitude < 2) {
        uVar1 = (r->y).n[1];
        uVar2 = (r->y).n[2];
        uVar3 = (r->y).n[3];
        (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
        (r->y).n[1] = 0x3ffffffffffffc - uVar1;
        (r->y).n[2] = 0x3ffffffffffffc - uVar2;
        (r->y).n[3] = 0x3ffffffffffffc - uVar3;
        (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
        (r->y).magnitude = 2;
        (r->y).normalized = 0;
        secp256k1_fe_verify(unaff_R14);
        return 1;
      }
      goto LAB_00121db1;
    }
  }
  else {
    secp256k1_extrakeys_ge_even_y_cold_1();
  }
  secp256k1_extrakeys_ge_even_y_cold_3();
LAB_00121db1:
  secp256k1_extrakeys_ge_even_y_cold_2();
  psStack_30 = r;
  psStack_28 = unaff_R14;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_xonly_pubkey_tweak_add_cold_4();
  }
  else if (in_RSI != (uint64_t *)0x0) {
    in_RSI[6] = 0;
    in_RSI[7] = 0;
    in_RSI[4] = 0;
    in_RSI[5] = 0;
    in_RSI[2] = 0;
    in_RSI[3] = 0;
    *in_RSI = 0;
    in_RSI[1] = 0;
    if (pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_xonly_pubkey_tweak_add_cold_2();
      return 0;
    }
    if (in_RCX == (uchar *)0x0) {
      secp256k1_xonly_pubkey_tweak_add_cold_1();
      return 0;
    }
    iVar4 = secp256k1_pubkey_load(ctx,&sStack_d8,pubkey);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = secp256k1_ec_pubkey_tweak_add_helper(&sStack_d8,in_RCX);
    if (iVar4 != 0) {
      secp256k1_ge_to_storage(&sStack_70,&sStack_d8);
      in_RSI[6] = sStack_70.y.n[2];
      in_RSI[7] = sStack_70.y.n[3];
      in_RSI[4] = sStack_70.y.n[0];
      in_RSI[5] = sStack_70.y.n[1];
      in_RSI[2] = sStack_70.x.n[2];
      in_RSI[3] = sStack_70.x.n[3];
      *in_RSI = sStack_70.x.n[0];
      in_RSI[1] = sStack_70.x.n[1];
      return 1;
    }
    return 0;
  }
  secp256k1_xonly_pubkey_tweak_add_cold_3();
  return 0;
}

Assistant:

static int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r) {
    int y_parity = 0;
    VERIFY_CHECK(!secp256k1_ge_is_infinity(r));

    if (secp256k1_fe_is_odd(&r->y)) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
        y_parity = 1;
    }
    return y_parity;
}